

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerUnion.h
# Opt level: O0

int __thiscall
llvm::
PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
::is<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
          (PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
           *this)

{
  int iVar1;
  bool local_19;
  ValTy local_18;
  PointerUnion4<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
  *local_10;
  PointerUnion4<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
  *this_local;
  
  local_10 = this;
  iVar1 = PointerUnion<llvm::PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>,llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
          ::
          is<llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
                    ((PointerUnion<llvm::PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>,llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
                      *)this);
  local_19 = false;
  if (iVar1 != 0) {
    local_18.Value =
         (intptr_t)
         PointerUnion<llvm::PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>,llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
         ::
         get<llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
                   ((PointerUnion<llvm::PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>,llvm::PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
                     *)this);
    iVar1 = PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
            ::is<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                      ((PointerUnion<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*>
                        *)&local_18);
    local_19 = iVar1 != 0;
  }
  return (int)local_19;
}

Assistant:

int is() const {
    // If T is PT1/PT2 choose InnerUnion1 otherwise choose InnerUnion2.
    using Ty = typename ::llvm::PointerUnionTypeSelector<
        PT1, T, InnerUnion1,
        ::llvm::PointerUnionTypeSelector<PT2, T, InnerUnion1,
                                         InnerUnion2>>::Return;
    return Val.template is<Ty>() && Val.template get<Ty>().template is<T>();
  }